

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O0

void __thiscall sf::Transformable::Transformable(Transformable *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Transformable_00493848;
  Vector2<float>::Vector2((Vector2<float> *)(in_RDI + 1),0.0,0.0);
  Vector2<float>::Vector2((Vector2<float> *)(in_RDI + 2),0.0,0.0);
  *(undefined4 *)(in_RDI + 3) = 0;
  Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x1c),1.0,1.0);
  Transform::Transform((Transform *)((long)in_RDI + 0x24));
  *(undefined1 *)((long)in_RDI + 100) = 1;
  Transform::Transform((Transform *)(in_RDI + 0xd));
  *(undefined1 *)(in_RDI + 0x15) = 1;
  return;
}

Assistant:

Transformable::Transformable() :
m_origin                    (0, 0),
m_position                  (0, 0),
m_rotation                  (0),
m_scale                     (1, 1),
m_transform                 (),
m_transformNeedUpdate       (true),
m_inverseTransform          (),
m_inverseTransformNeedUpdate(true)
{
}